

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

uint32 __thiscall
Js::PathTypeHandlerBase::ExtractSlotInfo_TTD
          (PathTypeHandlerBase *this,SnapHandlerPropertyEntry *entryInfo,
          ThreadContext *threadContext,SlabAllocator *alloc)

{
  PropertyId propId;
  ushort uVar1;
  SnapEntryDataKindTag dataKind;
  PropertyIndex PVar2;
  int iVar3;
  undefined4 extraout_var;
  PropertyRecord *pPVar5;
  uint32 index;
  ulong uVar6;
  byte bVar7;
  long lVar4;
  
  uVar1 = (this->super_DynamicTypeHandler).unusedBytes >> 1;
  iVar3 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    if (lVar4 == 0) {
      bVar7 = 7;
    }
    else {
      bVar7 = *(byte *)(lVar4 + uVar6);
    }
    pPVar5 = TypePath::GetPropertyIdUnchecked((this->typePath).ptr,(int)uVar6);
    propId = pPVar5->pid;
    if (bVar7 == 0xf7) {
      PVar2 = TypePath::LookupInline
                        ((this->typePath).ptr,propId,
                         (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
      bVar7 = *(byte *)(lVar4 + (ulong)PVar2);
      dataKind = Setter;
    }
    else {
      dataKind = (bVar7 & 0x10) == 0 ^ Getter;
    }
    TTD::NSSnapType::ExtractSnapPropertyEntryInfo(entryInfo,propId,bVar7 & 0xf,dataKind);
    entryInfo = entryInfo + 1;
  }
  return (uint32)uVar1;
}

Assistant:

uint32 PathTypeHandlerBase::ExtractSlotInfo_TTD(TTD::NSSnapType::SnapHandlerPropertyEntry* entryInfo, ThreadContext* threadContext, TTD::SlabAllocator& alloc) const
    {
        uint32 plength = this->GetPathLength();
        ObjectSlotAttributes * attributes = this->GetAttributeArray();

        for(uint32 index = 0; index < plength; ++index)
        {
            ObjectSlotAttributes attr = attributes ? attributes[index] : ObjectSlotAttr_Default;
            PropertyId propertyId = GetTypePath()->GetPropertyIdUnchecked(index)->GetPropertyId();
            TTD::NSSnapType::SnapEntryDataKindTag tag;
            if (attr == ObjectSlotAttr_Setter)
            {
                attr = attributes[GetTypePath()->LookupInline(propertyId, GetPathLength())];
                tag = TTD::NSSnapType::SnapEntryDataKindTag::Setter;
            }
            else if (attr & ObjectSlotAttr_Accessor)
            {
                tag = TTD::NSSnapType::SnapEntryDataKindTag::Getter;
            }
            else
            {
                tag = TTD::NSSnapType::SnapEntryDataKindTag::Data;
            }
            TTD::NSSnapType::ExtractSnapPropertyEntryInfo(entryInfo + index, propertyId, ObjectSlotAttributesToPropertyAttributes(attr), tag);
        }

        return plength;
    }